

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Virtual_Machine.cpp
# Opt level: O0

void __thiscall
Virtual_Machine::Virtual_Machine
          (Virtual_Machine *this,RPN *prog_par,
          vector<ID_table_t,_std::allocator<ID_table_t>_> *ID_tables_vec_par)

{
  const_iterator cVar1;
  vector<ID_table_t,_std::allocator<ID_table_t>_> *ID_tables_vec_par_local;
  RPN *prog_par_local;
  Virtual_Machine *this_local;
  
  this->prog = prog_par;
  cVar1 = std::vector<Lex,_std::allocator<Lex>_>::cbegin
                    (&this->prog->super_vector<Lex,_std::allocator<Lex>_>);
  (this->cmd_ptr)._M_current = cVar1._M_current;
  Lex::Lex(&this->c_cmd);
  this->ID_tables_vec = ID_tables_vec_par;
  Lex::Lex(&this->c_lex,LEX_NULL,0,0);
  Lex::Lex(&this->arg1,LEX_NULL,0,0);
  Lex::Lex(&this->arg2,LEX_NULL,0,0);
  std::__cxx11::string::string((string *)&this->tmp_str);
  return;
}

Assistant:

Virtual_Machine::Virtual_Machine(RPN &prog_par, vector<ID_table_t>& ID_tables_vec_par):
    prog(prog_par),
    cmd_ptr(prog.cbegin()),
    ID_tables_vec(ID_tables_vec_par),
    c_lex(LEX_NULL),
    arg1(LEX_NULL),
    arg2(LEX_NULL){}